

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::DrawTest::DrawTest
          (DrawTest *this,TestContext *testCtx,RenderContext *renderCtx,DrawTestSpec *spec,
          char *name,char *desc)

{
  char *desc_local;
  char *name_local;
  DrawTestSpec *spec_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  DrawTest *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__DrawTest_00cbb778;
  this->m_renderCtx = renderCtx;
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_glesContext = (Context *)0x0;
  this->m_glArrayPack = (AttributePack *)0x0;
  this->m_rrArrayPack = (AttributePack *)0x0;
  this->m_maxDiffRed = -1;
  this->m_maxDiffGreen = -1;
  this->m_maxDiffBlue = -1;
  std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::vector
            (&this->m_specs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_iteration_descriptions);
  this->m_iteration = 0;
  tcu::ResultCollector::ResultCollector(&this->m_result);
  addIteration(this,spec,(char *)0x0);
  return;
}

Assistant:

DrawTest::DrawTest (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const DrawTestSpec& spec, const char* name, const char* desc)
	: TestCase			(testCtx, name, desc)
	, m_renderCtx		(renderCtx)
	, m_refBuffers		(DE_NULL)
	, m_refContext		(DE_NULL)
	, m_glesContext		(DE_NULL)
	, m_glArrayPack		(DE_NULL)
	, m_rrArrayPack		(DE_NULL)
	, m_maxDiffRed		(-1)
	, m_maxDiffGreen	(-1)
	, m_maxDiffBlue		(-1)
	, m_iteration		(0)
	, m_result			()	// \note no per-iteration result logging (only one iteration)
{
	addIteration(spec);
}